

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O3

Status __thiscall
leveldb::TableCache::Get
          (TableCache *this,ReadOptions *options,uint64_t file_number,uint64_t file_size,Slice *k,
          void *arg,_func_void_void_ptr_Slice_ptr_Slice_ptr *handle_result)

{
  undefined8 uVar1;
  long lVar2;
  long in_FS_OFFSET;
  Table local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = 0;
  FindTable(this,(uint64_t)options,file_size,(Handle **)k);
  uVar1 = local_40;
  if (this->env_ == (Env *)0x0) {
    lVar2 = (**(code **)(**(long **)(options + 3) + 0x28))(*(long **)(options + 3),local_40);
    Table::InternalGet(&local_48,*(ReadOptions **)(lVar2 + 8),(Slice *)file_number,arg,handle_result
                      );
    this->env_ = (Env *)local_48.rep_;
    (**(code **)(**(long **)(options + 3) + 0x20))(*(long **)(options + 3),uVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status TableCache::Get(const ReadOptions& options, uint64_t file_number,
                       uint64_t file_size, const Slice& k, void* arg,
                       void (*handle_result)(void*, const Slice&,
                                             const Slice&)) {
  Cache::Handle* handle = nullptr;
  Status s = FindTable(file_number, file_size, &handle);
  if (s.ok()) {
    Table* t = reinterpret_cast<TableAndFile*>(cache_->Value(handle))->table;
    s = t->InternalGet(options, k, arg, handle_result);
    cache_->Release(handle);
  }
  return s;
}